

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

int exr_add_channel(exr_context_t ctxt,int part_index,char *name,exr_pixel_type_t ptype,
                   exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  int32_t in_EDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  undefined4 in_R9D;
  exr_attribute_list_t *unaff_retaddr;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  _internal_exr_part *p_Var1;
  uint in_stack_ffffffffffffffc0;
  exr_result_t eVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar2 = 0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar2 = 2;
  }
  else {
    p_Var3 = in_RDI;
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar2 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if (in_RDI->mode == '\0') {
        internal_exr_unlock(in_RDI);
        eVar2 = (*in_RDI->standard_error)(in_RDI,8);
      }
      else if (in_RDI->mode == '\x03') {
        internal_exr_unlock(in_RDI);
        eVar2 = (*in_RDI->standard_error)(in_RDI,0x15);
      }
      else {
        if (p_Var1->channels == (exr_attribute_t *)0x0) {
          eVar2 = exr_attr_list_add((exr_context_t)CONCAT44(part._4_4_,part._0_4_),unaff_retaddr,
                                    (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),
                                    (exr_attribute_type_t)((ulong)p_Var3 >> 0x20),(int32_t)p_Var3,
                                    (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    (exr_attribute_t **)attr);
        }
        else if (p_Var1->channels->type != EXR_ATTR_CHLIST) {
          internal_exr_unlock(in_RDI);
          eVar2 = (*in_RDI->print_error)
                            (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             p_Var1->channels->type_name,"channels");
          return eVar2;
        }
        if (eVar2 == 0) {
          eVar2 = exr_attr_chlist_add((exr_context_t)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                                      (exr_attr_chlist_t *)p_Var1->channels,
                                      (char *)(ulong)in_stack_ffffffffffffffc0,
                                      (exr_pixel_type_t)((ulong)in_RDI >> 0x20),
                                      (exr_perceptual_treatment_t)in_RDI,
                                      (int32_t)((ulong)p_Var1 >> 0x20),in_EDX);
        }
        internal_exr_unlock(in_RDI);
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_add_channel (
    exr_context_t              ctxt,
    int                        part_index,
    const char*                name,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    REQ_ATTR_FIND_CREATE (channels, EXR_ATTR_CHLIST);
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = exr_attr_chlist_add (
            ctxt, attr->chlist, name, ptype, islinear, xsamp, ysamp);
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}